

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_hdr_simple_create(lws *wsi,lws_token_indexes h,char *s)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  allocated_headers *paVar4;
  char *pcVar5;
  int iVar6;
  char *local_28;
  char *s_local;
  lws_token_indexes h_local;
  lws *wsi_local;
  
  if (*s == '\0') {
    ((wsi->http).ah)->frag_index[h] = '\0';
    wsi_local._4_4_ = 0;
  }
  else {
    paVar4 = (wsi->http).ah;
    paVar4->nfrag = paVar4->nfrag + '\x01';
    if (((wsi->http).ah)->nfrag == '`') {
      _lws_log(2,"More hdr frags than we can deal with, dropping\n");
      wsi_local._4_4_ = -1;
    }
    else {
      ((wsi->http).ah)->frag_index[h] = ((wsi->http).ah)->nfrag;
      ((wsi->http).ah)->frags[((wsi->http).ah)->nfrag].offset = ((wsi->http).ah)->pos;
      ((wsi->http).ah)->frags[((wsi->http).ah)->nfrag].len = 0;
      ((wsi->http).ah)->frags[((wsi->http).ah)->nfrag].nfrag = '\0';
      local_28 = s;
      do {
        iVar6 = lws_pos_in_bounds(wsi);
        if (iVar6 != 0) {
          return -1;
        }
        cVar1 = *local_28;
        pcVar5 = ((wsi->http).ah)->data;
        paVar4 = (wsi->http).ah;
        uVar3 = paVar4->pos;
        paVar4->pos = uVar3 + 1;
        pcVar5[uVar3] = cVar1;
        if (*local_28 != '\0') {
          paVar4 = (wsi->http).ah;
          bVar2 = ((wsi->http).ah)->nfrag;
          paVar4->frags[bVar2].len = paVar4->frags[bVar2].len + 1;
        }
        cVar1 = *local_28;
        local_28 = local_28 + 1;
      } while (cVar1 != '\0');
      wsi_local._4_4_ = 0;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_hdr_simple_create(struct lws *wsi, enum lws_token_indexes h, const char *s)
{
	if (!*s) {
		/*
		 * If we get an empty string, then remove any entry for the
		 * header
		 */
		wsi->http.ah->frag_index[h] = 0;

		return 0;
	}

	wsi->http.ah->nfrag++;
	if (wsi->http.ah->nfrag == LWS_ARRAY_SIZE(wsi->http.ah->frags)) {
		lwsl_warn("More hdr frags than we can deal with, dropping\n");
		return -1;
	}

	wsi->http.ah->frag_index[h] = wsi->http.ah->nfrag;

	wsi->http.ah->frags[wsi->http.ah->nfrag].offset = wsi->http.ah->pos;
	wsi->http.ah->frags[wsi->http.ah->nfrag].len = 0;
	wsi->http.ah->frags[wsi->http.ah->nfrag].nfrag = 0;

	do {
		if (lws_pos_in_bounds(wsi))
			return -1;

		wsi->http.ah->data[wsi->http.ah->pos++] = *s;
		if (*s)
			wsi->http.ah->frags[wsi->http.ah->nfrag].len++;
	} while (*s++);

	return 0;
}